

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType1Interpreter.cpp
# Opt level: O1

EStatusCode __thiscall
CharStringType1Interpreter::InterpretOperator
          (CharStringType1Interpreter *this,Byte inBuffer,
          InputCharStringDecodeStream *inCharStringToIntepret,bool *outGotEndExecutionCommand)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  EStatusCode EVar3;
  undefined7 in_register_00000031;
  Byte buffer;
  byte local_19;
  
  *outGotEndExecutionCommand = false;
  if ((int)CONCAT71(in_register_00000031,inBuffer) == 0xc) {
    iVar1 = (*(inCharStringToIntepret->super_IByteReader)._vptr_IByteReader[2])
                      (inCharStringToIntepret,&local_19,1);
    if (CONCAT44(extraout_var,iVar1) != 1) {
      return eFailure;
    }
    uVar2 = local_19 | 0xc00;
  }
  else {
    uVar2 = (uint)inBuffer;
  }
  EVar3 = eFailure;
  switch(uVar2) {
  case 1:
    iVar1 = (**this->mImplementationHelper->_vptr_IType1InterpreterImplementation)
                      (this->mImplementationHelper,this);
    break;
  case 2:
  case 0xc:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
    goto switchD_00202d76_caseD_2;
  case 3:
    iVar1 = (*this->mImplementationHelper->_vptr_IType1InterpreterImplementation[1])
                      (this->mImplementationHelper,this);
    break;
  case 4:
    iVar1 = (*this->mImplementationHelper->_vptr_IType1InterpreterImplementation[2])
                      (this->mImplementationHelper,this);
    break;
  case 5:
    iVar1 = (*this->mImplementationHelper->_vptr_IType1InterpreterImplementation[3])
                      (this->mImplementationHelper,this);
    break;
  case 6:
    iVar1 = (*this->mImplementationHelper->_vptr_IType1InterpreterImplementation[4])
                      (this->mImplementationHelper,this);
    break;
  case 7:
    iVar1 = (*this->mImplementationHelper->_vptr_IType1InterpreterImplementation[5])
                      (this->mImplementationHelper,this);
    break;
  case 8:
    iVar1 = (*this->mImplementationHelper->_vptr_IType1InterpreterImplementation[6])
                      (this->mImplementationHelper,this);
    break;
  case 9:
    iVar1 = (*this->mImplementationHelper->_vptr_IType1InterpreterImplementation[7])
                      (this->mImplementationHelper,this);
    break;
  case 10:
    EVar3 = InterpretCallSubr(this);
    return EVar3;
  case 0xb:
    iVar1 = (*this->mImplementationHelper->_vptr_IType1InterpreterImplementation[9])
                      (this->mImplementationHelper,this);
    *outGotEndExecutionCommand = true;
    return -(uint)(iVar1 != 0);
  case 0xd:
    iVar1 = (*this->mImplementationHelper->_vptr_IType1InterpreterImplementation[10])
                      (this->mImplementationHelper,this);
    break;
  case 0xe:
    iVar1 = (*this->mImplementationHelper->_vptr_IType1InterpreterImplementation[0xb])
                      (this->mImplementationHelper,this);
    if (iVar1 != 0) {
      return eFailure;
    }
    this->mGotEndChar = true;
    goto LAB_00202f4e;
  case 0x15:
    iVar1 = (*this->mImplementationHelper->_vptr_IType1InterpreterImplementation[0xc])
                      (this->mImplementationHelper,this);
    break;
  case 0x16:
    iVar1 = (*this->mImplementationHelper->_vptr_IType1InterpreterImplementation[0xd])
                      (this->mImplementationHelper,this);
    break;
  case 0x1e:
    iVar1 = (*this->mImplementationHelper->_vptr_IType1InterpreterImplementation[0xe])
                      (this->mImplementationHelper,this);
    break;
  case 0x1f:
    iVar1 = (*this->mImplementationHelper->_vptr_IType1InterpreterImplementation[0xf])
                      (this->mImplementationHelper,this);
    break;
  default:
    switch(uVar2) {
    case 0xc00:
      iVar1 = (*this->mImplementationHelper->_vptr_IType1InterpreterImplementation[0x10])
                        (this->mImplementationHelper,this);
      break;
    case 0xc01:
      iVar1 = (*this->mImplementationHelper->_vptr_IType1InterpreterImplementation[0x11])
                        (this->mImplementationHelper,this);
      break;
    case 0xc02:
      iVar1 = (*this->mImplementationHelper->_vptr_IType1InterpreterImplementation[0x12])
                        (this->mImplementationHelper,this);
      break;
    case 0xc03:
    case 0xc04:
    case 0xc05:
    case 0xc08:
    case 0xc09:
    case 0xc0a:
    case 0xc0b:
    case 0xc0d:
    case 0xc0e:
    case 0xc0f:
      goto switchD_00202d76_caseD_2;
    case 0xc06:
      iVar1 = (*this->mImplementationHelper->_vptr_IType1InterpreterImplementation[0x13])
                        (this->mImplementationHelper,this);
      break;
    case 0xc07:
      iVar1 = (*this->mImplementationHelper->_vptr_IType1InterpreterImplementation[0x14])
                        (this->mImplementationHelper,this);
      break;
    case 0xc0c:
      EVar3 = InterpretDiv(this);
      return EVar3;
    case 0xc10:
      EVar3 = InterpretCallOtherSubr(this);
      return EVar3;
    case 0xc11:
      EVar3 = InterpretPop(this);
      return EVar3;
    default:
      if (uVar2 != 0xc21) {
        return eFailure;
      }
      iVar1 = (*this->mImplementationHelper->_vptr_IType1InterpreterImplementation[0x19])
                        (this->mImplementationHelper,this);
    }
  }
  if (iVar1 == 0) {
LAB_00202f4e:
    std::__cxx11::list<long,_std::allocator<long>_>::clear(&this->mOperandStack);
    EVar3 = eSuccess;
  }
switchD_00202d76_caseD_2:
  return EVar3;
}

Assistant:

EStatusCode CharStringType1Interpreter::InterpretOperator(Byte inBuffer,InputCharStringDecodeStream* inCharStringToIntepret,bool& outGotEndExecutionCommand)
{
	EStatusCode status = eFailure;
	unsigned short operatorValue;
	outGotEndExecutionCommand = false;
	Byte buffer;
	
	if(12 == inBuffer)
	{
		if(inCharStringToIntepret->Read(&buffer,1) != 1)
			return eFailure;

		operatorValue = 0x0c00 + buffer;
	}
	else
	{
		operatorValue = inBuffer;
	}

	switch(operatorValue)
	{
		case 1: // hstem
			status = InterpretHStem();
			break;
		case 3: // vstem
			status = InterpretVStem();
			break;
		case 4: // vmoveto
			status = InterpretVMoveto();
			break;
		case 5: // rlineto
			status = InterpretRLineto();
			break;
		case 6: // hlineto
			status = InterpretHLineto();
			break;
		case 7: // vlineto
			status = InterpretVLineto();
			break;
		case 8: // rrcurveto
			status = InterpretRRCurveto();
			break;
		case 9: // closepath
			status = InterpretClosePath();
			break;
		case 10: // callsubr
			status = InterpretCallSubr();
			break;
		case 11: // return
			status = InterpretReturn();
			outGotEndExecutionCommand = true;
			break;
		case 13: // hsbw
			status = InterpretHsbw();
			break;
		case 14: // endchar
			status = InterpretEndChar();
			break;
		case 21: // rmoveto
			status = InterpretRMoveto();
			break;
		case 22: // hmoveto
			status = InterpretHMoveto();
			break;
		case 30: // vhcurveto
			status = InterpretVHCurveto();
			break;
		case 31: // hvcurveto
			status = InterpretHVCurveto();
			break;
		
		case 0x0c00: // dotsection
			status = InterpretDotSection();
			break;
		case 0x0c01: // vstem3
			status = InterpretVStem3();
			break;
		case 0x0c02: // hstem3
			status = InterpretHStem3();
			break;
		case 0x0c06: // seac
			status = InterpretSeac();
			break;
		case 0x0c07: // sbw
			status = InterpretSbw();
			break;
		case 0x0c0c: // div
			status = InterpretDiv();
			break;
		case 0x0c10: // callothersubr
			status = InterpretCallOtherSubr();
			break;
		case 0x0c11: // pop
			status = InterpretPop();
			break;
		case 0x0c21: // setcurrentpoint
			status = InterpretSetCurrentPoint();
			break;
	}
	return status;	
}